

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

ly_set * lyd_find_xpath(lyd_node *data,char *expr)

{
  int iVar1;
  undefined4 uVar2;
  ly_set *set;
  LY_ERR *pLVar3;
  lys_module *plVar4;
  ushort uVar5;
  undefined1 auStack_58 [8];
  lyxp_set xp_set;
  
  if (data == (lyd_node *)0x0 || expr == (char *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
    set = (ly_set *)0x0;
  }
  else {
    xp_set.val._8_8_ = 0;
    xp_set.used = 0;
    xp_set.size = 0;
    xp_set._8_8_ = 0;
    xp_set.val.nodes = (lyxp_set_nodes *)0x0;
    auStack_58 = (undefined1  [8])0x0;
    xp_set.type = LYXP_SET_EMPTY;
    xp_set._4_4_ = 0;
    plVar4 = data->schema->module;
    if ((plVar4->field_0x40 & 1) != 0) {
      plVar4 = (lys_module *)plVar4->data;
    }
    set = (ly_set *)0x0;
    iVar1 = lyxp_eval(expr,data,LYXP_NODE_ELEM,plVar4,(lyxp_set *)auStack_58,0);
    if (iVar1 == 0) {
      set = (ly_set *)calloc(1,0x10);
      if (set == (ly_set *)0x0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        set = (ly_set *)0x0;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_find_xpath");
      }
      else {
        if ((auStack_58._0_4_ == LYXP_SET_NODE_SET) && (xp_set.val._8_4_ != 0)) {
          uVar5 = 0;
          uVar2 = xp_set.val._8_4_;
          do {
            if (*(int *)(xp_set._8_8_ + 8 + (ulong)uVar5 * 0x10) == 2) {
              iVar1 = ly_set_add(set,*(void **)(xp_set._8_8_ + (ulong)uVar5 * 0x10),1);
              if (iVar1 < 0) {
                free((set->set).s);
                free(set);
                set = (ly_set *)0x0;
                break;
              }
              uVar2 = xp_set.val._8_4_;
            }
            uVar5 = uVar5 + 1;
          } while ((uint)uVar5 < (uint)uVar2);
        }
        lyxp_set_cast((lyxp_set *)auStack_58,LYXP_SET_EMPTY,data,(lys_module *)0x0,0);
      }
    }
  }
  return set;
}

Assistant:

ly_set *
lyd_find_xpath(const struct lyd_node *data, const char *expr)
{
    struct lyxp_set xp_set;
    struct ly_set *set;
    uint16_t i;

    if (!data || !expr) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    memset(&xp_set, 0, sizeof xp_set);

    if (lyxp_eval(expr, data, LYXP_NODE_ELEM, lyd_node_module(data), &xp_set, 0) != EXIT_SUCCESS) {
        return NULL;
    }

    set = ly_set_new();
    if (!set) {
        LOGMEM;
        return NULL;
    }

    if (xp_set.type == LYXP_SET_NODE_SET) {
        for (i = 0; i < xp_set.used; ++i) {
            if (xp_set.val.nodes[i].type == LYXP_NODE_ELEM) {
                if (ly_set_add(set, xp_set.val.nodes[i].node, LY_SET_OPT_USEASLIST) < 0) {
                    ly_set_free(set);
                    set = NULL;
                    break;
                }
            }
        }
    }
    /* free xp_set content */
    lyxp_set_cast(&xp_set, LYXP_SET_EMPTY, data, NULL, 0);

    return set;
}